

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::connect
          (PromiseNetworkAddressHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  SourceLocation location;
  PromiseNetworkAddressHttpClient *__addr_00;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *this_00;
  NetworkAddressHttpClient *pNVar1;
  TypeByIndex<0UL,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>
  *t;
  Promise<kj::HttpClient::ConnectRequest::Status> *pPVar2;
  TypeByIndex<1UL,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>
  *t_00;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *pPVar3;
  int __flags;
  undefined4 in_register_0000000c;
  char *pcVar4;
  StringPtr *params;
  void *__child_stack;
  undefined4 in_register_00000034;
  __fn *in_R8;
  __fn *__arg;
  HttpConnectSettings *in_R9;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> local_150 [2];
  SourceLocation local_140;
  long local_118;
  String local_110;
  HttpHeaders local_f8;
  HttpConnectSettings local_98;
  undefined1 local_88 [24];
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *c;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *_c6249;
  HttpConnectSettings *settings_local;
  HttpHeaders *headers_local;
  PromiseNetworkAddressHttpClient *this_local;
  StringPtr host_local;
  
  pcVar4 = (char *)CONCAT44(in_register_0000000c,__len);
  __arg = in_R8;
  this_local = (PromiseNetworkAddressHttpClient *)__addr;
  host_local.content.ptr = pcVar4;
  host_local.content.size_ = (size_t)this;
  this_00 = kj::_::readMaybe<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>
                      ((Maybe<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>_>
                        *)(CONCAT44(in_register_00000034,__fd) + 0x18));
  __flags = (int)pcVar4;
  if (this_00 == (Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_88);
    local_118 = CONCAT44(in_register_00000034,__fd);
    str<kj::StringPtr&>(&local_110,(kj *)&this_local,params);
    HttpHeaders::clone(&local_f8,in_R8,__child_stack,__flags,__arg);
    HttpConnectSettings::HttpConnectSettings(&local_98,in_R9);
    Promise<void>::
    then<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda()_1_>
              ((Promise<void> *)(local_88 + 8),(Type *)local_88);
    SourceLocation::SourceLocation
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"connect",0x186c,0x14);
    location.function = local_140.function;
    location.fileName = local_140.fileName;
    location.lineNumber = local_140.lineNumber;
    location.columnNumber = local_140.columnNumber;
    Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
    ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
             *)(local_88 + 0x10),location);
    Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
    ::~Promise((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
                *)(local_88 + 8));
    (anonymous_namespace)::PromiseNetworkAddressHttpClient::
    connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda()#1}::
    ~HttpConnectSettings((_lambda___1_ *)&local_118);
    Promise<void>::~Promise((Promise<void> *)local_88);
    t = get<0ul,kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>&>
                  ((Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
                    *)(local_88 + 0x10));
    pPVar2 = mv<kj::Promise<kj::HttpClient::ConnectRequest::Status>>(t);
    Promise<kj::HttpClient::ConnectRequest::Status>::Promise
              ((Promise<kj::HttpClient::ConnectRequest::Status> *)this,pPVar2);
    t_00 = get<1ul,kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>&>
                     ((Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
                       *)(local_88 + 0x10));
    pPVar3 = mv<kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>(t_00);
    Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::Promise(local_150,pPVar3);
    newPromisedStream((kj *)&this->promise,local_150);
    Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise(local_150);
    kj::_::
    Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
    ::~Tuple((Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
              *)(local_88 + 0x10));
  }
  else {
    pNVar1 = Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>::operator->
                       (this_00);
    pcVar4 = host_local.content.ptr;
    __addr_00 = this_local;
    HttpConnectSettings::HttpConnectSettings
              ((HttpConnectSettings *)
               &split.impl.
                super_TupleElement<1U,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>,
               in_R9);
    NetworkAddressHttpClient::connect
              ((NetworkAddressHttpClient *)this,(int)pNVar1,(sockaddr *)__addr_00,(socklen_t)pcVar4)
    ;
  }
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    KJ_IF_SOME(c, client) {
      return c->connect(host, headers, settings);
    } else {
      auto split = promise.addBranch().then(
          [this, host=kj::str(host), headers=headers.clone(), settings]() mutable
          -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                       kj::Promise<kj::Own<kj::AsyncIoStream>>> {
        auto request = KJ_ASSERT_NONNULL(client)->connect(host, headers, kj::mv(settings));
        return kj::tuple(kj::mv(request.status), kj::mv(request.connection));
      }).split();

      return ConnectRequest {
        kj::mv(kj::get<0>(split)),
        kj::newPromisedStream(kj::mv(kj::get<1>(split)))
      };
    }